

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O2

void __thiscall
helics::CoreBroker::globalError(CoreBroker *this,int32_t errorCode,string_view errorString)

{
  ActionMessage error;
  basic_string_view<char,_std::char_traits<char>_> local_e8;
  ActionMessage local_d8;
  
  local_e8._M_str = errorString._M_str;
  local_e8._M_len = errorString._M_len;
  ActionMessage::ActionMessage(&local_d8,cmd_global_error);
  local_d8.source_id.gid = (this->super_BrokerBase).global_id._M_i.gid;
  local_d8.messageID = errorCode;
  SmallBuffer::operator=(&local_d8.payload,&local_e8);
  BrokerBase::addActionMessage(&this->super_BrokerBase,&local_d8);
  ActionMessage::~ActionMessage(&local_d8);
  return;
}

Assistant:

void CoreBroker::globalError(int32_t errorCode, std::string_view errorString)
{
    ActionMessage error(CMD_GLOBAL_ERROR);
    error.source_id = getGlobalId();
    error.messageID = errorCode;
    error.payload = errorString;
    addActionMessage(error);
}